

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

Test * ParserTestPhonySelfReferenceIgnored::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1e8);
  ParserTestPhonySelfReferenceIgnored((ParserTestPhonySelfReferenceIgnored *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(ParserTest, PhonySelfReferenceIgnored) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"build a: phony a\n"
));

  Node* node = state.LookupNode("a");
  Edge* edge = node->in_edge();
  ASSERT_TRUE(edge->inputs_.empty());
}